

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzhierarquicalgrid.cpp
# Opt level: O3

TPZGeoMesh * __thiscall
TPZHierarquicalGrid::ComputeExtrusion(TPZHierarquicalGrid *this,REAL t,REAL dt,int n)

{
  double dVar1;
  TPZFunction<double> *pTVar2;
  int eldim;
  TPZGeoMesh *pTVar3;
  ulong uVar4;
  TPZGeoNode *pTVar5;
  TPZGeoNode *this_00;
  TPZGeoMesh *pTVar6;
  TPZGeoEl **ppTVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int elid;
  TPZVec<double> Coordinates;
  TPZVec<double> NewCoordinates;
  TPZVec<double> NewCoordinates_r;
  ulong local_128;
  long local_120;
  TPZVec<double> local_108;
  ulong local_e8;
  ulong local_e0;
  REAL local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  double local_b8;
  double local_b0;
  TPZVec<double> local_a8;
  TPZVec<double> local_88;
  double local_68;
  ulong uStack_60;
  TPZVec<double> local_50;
  
  uVar9 = n + 1;
  local_d8 = t;
  TPZVec<TPZAutoPointer<TPZGeoMesh>_>::Resize(&this->fSubBases,(long)(int)uVar9);
  pTVar3 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(pTVar3);
  this->fComputedGeomesh = pTVar3;
  uVar10 = (((this->fBase).fRef)->fPointer->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.
           fNElements;
  TPZAdmChunkVector<TPZGeoNode,_10>::Resize(&pTVar3->fNodeVec,uVar9 * (int)uVar10);
  uVar8 = 0;
  if (-1 < n) {
    uVar4 = uVar10 & 0xffffffff;
    local_d0 = (ulong)uVar9;
    local_68 = 1.0;
    uStack_60 = 0;
    local_120 = 0;
    local_128 = 0;
    local_e8 = (ulong)(uint)n;
    local_e0 = uVar10;
    do {
      if (0 < (int)uVar10) {
        local_b8 = (double)(int)local_128 * dt + local_d8;
        uVar10 = 0;
        local_c8 = uVar8;
        local_c0 = uVar8;
        do {
          TPZVec<double>::TPZVec(&local_108,1);
          local_88._vptr_TPZVec = (_func_int **)0x0;
          TPZVec<double>::TPZVec(&local_50,3,(double *)&local_88);
          local_a8._vptr_TPZVec = (_func_int **)0x0;
          TPZVec<double>::TPZVec(&local_88,3,(double *)&local_a8);
          *local_108.fStore = local_b8;
          local_b0 = 0.0;
          TPZVec<double>::TPZVec(&local_a8,3,&local_b0);
          pTVar5 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&(((this->fBase).fRef)->fPointer->fNodeVec).
                               super_TPZChunkVector<TPZGeoNode,_10>,uVar10);
          lVar11 = local_120 + uVar10;
          this_00 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                              (&(this->fComputedGeomesh->fNodeVec).
                                super_TPZChunkVector<TPZGeoNode,_10>,lVar11);
          TPZGeoNode::operator=(this_00,pTVar5);
          pTVar5 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&(this->fComputedGeomesh->fNodeVec).
                               super_TPZChunkVector<TPZGeoNode,_10>,lVar11);
          TPZGeoNode::GetCoordinates(pTVar5,&local_a8);
          pTVar2 = ((this->fParametricFunction).fRef)->fPointer;
          (**(code **)((long)*pTVar2 + 0x60))(pTVar2,&local_108,&local_88);
          dVar1 = *local_88.fStore;
          *local_50.fStore = dVar1;
          local_50.fStore[1] = local_88.fStore[1];
          local_50.fStore[2] = local_88.fStore[2];
          if ((((local_128 & 1) == 0) || (this->fNonAffineQ != true)) ||
             (((this->fBase).fRef)->fPointer->fDim != 2)) {
            *local_a8.fStore = dVar1 + *local_a8.fStore;
            local_a8.fStore[1] = local_50.fStore[1] + local_a8.fStore[1];
            local_a8.fStore[2] = local_50.fStore[2] + local_a8.fStore[2];
          }
          else {
            *local_a8.fStore = dVar1 + *local_a8.fStore;
            local_a8.fStore[1] = local_50.fStore[1] + local_a8.fStore[1];
            local_a8.fStore[2] = local_68 * dt * 0.5 + local_50.fStore[2] + local_a8.fStore[2];
            local_68 = -local_68;
            uStack_60 = uStack_60 ^ 0x8000000000000000;
          }
          pTVar5 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&(this->fComputedGeomesh->fNodeVec).
                               super_TPZChunkVector<TPZGeoNode,_10>,lVar11);
          TPZGeoNode::SetCoord(pTVar5,&local_a8);
          pTVar5 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&(this->fComputedGeomesh->fNodeVec).
                               super_TPZChunkVector<TPZGeoNode,_10>,lVar11);
          pTVar5->fId = (int)local_c0 + (int)uVar10;
          local_a8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          if (local_a8.fStore != (double *)0x0) {
            operator_delete__(local_a8.fStore);
          }
          local_88._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          if (local_88.fStore != (double *)0x0) {
            operator_delete__(local_88.fStore);
          }
          local_50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          if (local_50.fStore != (double *)0x0) {
            operator_delete__(local_50.fStore);
          }
          local_108._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          if (local_108.fStore != (double *)0x0) {
            operator_delete__(local_108.fStore);
          }
          uVar10 = uVar10 + 1;
        } while (uVar4 != uVar10);
        uVar8 = (ulong)(uint)((int)local_c8 + (int)uVar10);
        uVar10 = local_e0;
      }
      local_128 = local_128 + 1;
      local_120 = local_120 + uVar4;
    } while (local_128 != local_d0);
    uVar8 = (ulong)(int)uVar8;
    n = (int)local_e8;
  }
  pTVar3 = this->fComputedGeomesh;
  if ((long)uVar8 < pTVar3->fNodeMaxId) {
    uVar8 = pTVar3->fNodeMaxId;
  }
  pTVar3->fNodeMaxId = uVar8;
  local_108._vptr_TPZVec = (_func_int **)((ulong)local_108._vptr_TPZVec & 0xffffffff00000000);
  pTVar6 = ((this->fBase).fRef)->fPointer;
  if ((pTVar6->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements < 1) {
    lVar11 = 0;
  }
  else {
    lVar11 = 0;
    do {
      ppTVar7 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(pTVar6->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,lVar11);
      eldim = (**(code **)(*(long *)*ppTVar7 + 0x210))();
      ppTVar7 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->fBase).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,lVar11);
      CreateGeometricElement(this,n,(int)lVar11,eldim,(*ppTVar7)->fMatId,(int *)&local_108);
      lVar11 = lVar11 + 1;
      pTVar6 = ((this->fBase).fRef)->fPointer;
    } while (lVar11 < (pTVar6->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements);
    pTVar3 = this->fComputedGeomesh;
    lVar11 = (long)(int)local_108._vptr_TPZVec;
  }
  if (lVar11 < pTVar3->fElementMaxId) {
    lVar11 = pTVar3->fElementMaxId;
  }
  pTVar3->fElementMaxId = lVar11;
  TPZGeoMesh::BuildConnectivity(pTVar3);
  return this->fComputedGeomesh;
}

Assistant:

TPZGeoMesh * TPZHierarquicalGrid::ComputeExtrusion(REAL t, REAL dt, int n)
{
    fSubBases.Resize(n+1);
    fComputedGeomesh = new TPZGeoMesh;
    int NNodesBase = fBase->NNodes();
    fComputedGeomesh->NodeVec().Resize( (n+1) * NNodesBase);
    
    // Creating new elements
    int nodeId = 0;
    REAL sing = 1.0;
    for(int il = 0; il < (n+1); il++ )
    {
        // copying l extrusions
        // For a while all of them are equal
        //        fSubBases[il] = new TPZGeoMesh(fBase);
        
        for(int inode = 0; inode < NNodesBase; inode++)
        {
            TPZVec<REAL> tpara(1),NewCoordinates_r(3,0.0);
            TPZVec<REAL> NewCoordinates(3,0.0);
            tpara[0] = dt*il+t;
            
            TPZVec<REAL> Coordinates(3,0.0);
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase] =  fBase->NodeVec()[inode];
            //            NewGeomesh->NodeVec()[inode + il*fBase->NNodes()] =  fSubBases[il]->NodeVec()[inode];
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase].GetCoordinates(Coordinates);
            
            fParametricFunction->Execute(tpara,NewCoordinates);
            NewCoordinates_r[0] = REAL(NewCoordinates[0]);
            NewCoordinates_r[1] = REAL(NewCoordinates[1]);
            NewCoordinates_r[2] = REAL(NewCoordinates[2]);
            
            if(((il+1)%2==0 && fNonAffineQ) && fBase->Dimension() == 2){
                Coordinates[0]+=NewCoordinates_r[0];
                Coordinates[1]+=NewCoordinates_r[1];
                Coordinates[2]+=NewCoordinates_r[2];
                Coordinates[2]+= sing*dt/2.0;
                sing *= -1.0;
            }
            else{
                Coordinates[0]+=NewCoordinates_r[0];
                Coordinates[1]+=NewCoordinates_r[1];
                Coordinates[2]+=NewCoordinates_r[2];
            }
            
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase].SetCoord(Coordinates);
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase].SetNodeId(nodeId);
            nodeId++;
        }
    }
    
    fComputedGeomesh->SetMaxNodeId(nodeId);
    
//    int fbasedim = fBase->Dimension();
    
    int elid=0;
    for(int iel = 0; iel < fBase->NElements(); iel++)
    {
        int ielDim      = fBase->ElementVec()[iel]->Dimension();
        int ielMatId    = fBase->ElementVec()[iel]->MaterialId();
        CreateGeometricElement(n,iel,ielDim,ielMatId,elid);
    }
    
    fComputedGeomesh->SetMaxElementId(elid);
    fComputedGeomesh->BuildConnectivity();
    return fComputedGeomesh;
    
}